

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O2

string * __thiscall smf::Options::getCommandLine_abi_cxx11_(Options *this)

{
  string *psVar1;
  long lVar2;
  
  psVar1 = &this->m_commandString;
  if ((this->m_commandString)._M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)psVar1);
    for (lVar2 = 1; lVar2 < this->m_oargc; lVar2 = lVar2 + 1) {
      std::__cxx11::string::append((char *)psVar1);
      std::__cxx11::string::append((string *)psVar1);
    }
  }
  return psVar1;
}

Assistant:

const std::string& Options::getCommandLine(void) {
   if (m_commandString.size()) {
      return m_commandString;
   }

   m_commandString = m_oargv[0];

   int i;
   for (i=1; i<m_oargc; i++) {
      m_commandString += " ";
      m_commandString += m_oargv[i];
   }

   return m_commandString;
}